

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smatrix.h
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
gmath::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,SMatrix<double,_3,_3> *a)

{
  double *pdVar1;
  char *pcVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  
  pcVar2 = "[";
  lVar3 = 0;
  do {
    std::operator<<(out,pcVar2);
    pdVar1 = a->v[lVar3] + 1;
    lVar4 = lVar3;
    do {
      if (lVar4 == 3) {
        std::operator<<(out,"]");
        return out;
      }
      std::ostream::_M_insert<double>(a->v[lVar4][0]);
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        std::operator<<(out," ");
        std::ostream::_M_insert<double>(pdVar1[lVar3]);
      }
      lVar3 = lVar4 + 1;
      pdVar1 = pdVar1 + 3;
      bVar5 = lVar4 == 2;
      lVar4 = lVar3;
    } while (bVar5);
    pcVar2 = "; ";
  } while( true );
}

Assistant:

std::basic_ostream<Ch, Tr> &operator<<(std::basic_ostream<Ch, Tr> &out,
                                       const SMatrix<T, nrows, ncols> &a)
{
  out << "[";

  for (int k=0; k<nrows; k++)
  {
    out << a(k, 0);

    for (int i=1; i<ncols; i++)
    {
      out << " " << a(k, i);
    }

    if (k+1 < nrows)
    {
      out << "; ";
    }
  }

  out << "]";

  return out;
}